

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O2

void __thiscall libDAI::NDP::ComputeHeuristicVariableOrdering(NDP *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *__x;
  _Iter_comp_iter<libDAI::NDP::VariableHasLowerDegree> __comp;
  undefined4 extraout_var_01;
  reference pvVar2;
  value_type vVar3;
  reference pvVar4;
  ostream *poVar5;
  size_t i_1;
  size_t i;
  ulong uVar6;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> v;
  _Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> local_40;
  undefined4 extraout_var_00;
  
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  __x = (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
                  ((long *)CONCAT44(extraout_var,iVar1));
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
            ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_40,__x);
  __comp._M_comp._m_grm._0_4_ =
       (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  __comp._M_comp._m_grm._4_4_ = extraout_var_00;
  std::
  __sort<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__ops::_Iter_comp_iter<libDAI::NDP::VariableHasLowerDegree>>
            ((__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              )local_40._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              )local_40._M_impl.super__Vector_impl_data._M_finish,__comp);
  this_00 = &this->_m_varOrder;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (this_00,(long)local_40._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_40._M_impl.super__Vector_impl_data._M_start >> 4);
  for (uVar6 = 0;
      uVar6 < (ulong)((long)local_40._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_40._M_impl.super__Vector_impl_data._M_start >> 4);
      uVar6 = uVar6 + 1) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    pvVar2 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::at
                       ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_40,uVar6);
    vVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x40))
                      ((long *)CONCAT44(extraout_var_01,iVar1),pvVar2);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(this_00,uVar6);
    *pvVar4 = vVar3;
  }
  if (3 < (this->Props).verbose) {
    std::operator<<((ostream *)&std::cout,"variable ordering computed:\n[");
    for (uVar6 = 0;
        uVar6 < (ulong)((long)local_40._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_40._M_impl.super__Vector_impl_data._M_start >> 4);
        uVar6 = uVar6 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(this_00,uVar6);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar5,", ");
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"]");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void NDP::ComputeHeuristicVariableOrdering()
    {
        //NDPMemFn vhld = &NDP::VariableHasLowerDegree;
        std::vector< Var > v = grm().vars();
        //variable with lower degrees first:
        VariableHasLowerDegree vhld(grm());
        std::sort(v.begin(), v.end(), vhld);

        _m_varOrder.resize( v.size() );
        for(size_t i=0; i<v.size(); i++)
        {
            size_t varI = grm().findVar( v.at(i) );
            _m_varOrder.at(i) = varI;
        }

        if( Props.verbose > 3)
        {
            cout << "variable ordering computed:\n[";
            for(size_t i=0; i<v.size(); i++)
                cout <<  _m_varOrder.at(i) << ", ";
            cout << "]"<<endl;
        }

    }